

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprPhrase *
sqlite3Fts5ParseTerm(Fts5Parse *pParse,Fts5ExprPhrase *pAppend,Fts5Token *pToken,int bPrefix)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  undefined8 in_RDX;
  Fts5Config *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int n;
  int flags;
  int rc;
  Fts5Config *pConfig;
  char *z;
  TokenCtx sCtx;
  char **in_stack_ffffffffffffff88;
  Fts5Token *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  undefined8 uVar4;
  int nText;
  undefined4 in_stack_ffffffffffffffb0;
  u8 uVar5;
  Fts5Config *local_30;
  Fts5Config *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  iVar2 = (int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *in_RDI;
  local_20 = (Fts5Config *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  memset(&local_20,0,0x18);
  local_20 = in_RSI;
  local_18 = (undefined1 *)uVar4;
  iVar1 = fts5ParseStringFromToken(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  nText = (int)((ulong)uVar4 >> 0x20);
  if (iVar1 == 0) {
    in_stack_ffffffffffffffa0 = 0;
    if (in_ECX != 0) {
      in_stack_ffffffffffffffa0 = 2;
    }
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 | 1;
    sqlite3Fts5Dequote((char *)in_stack_ffffffffffffff90);
    sVar3 = strlen((char *)0x0);
    in_stack_ffffffffffffff9c = (undefined4)sVar3;
    iVar1 = sqlite3Fts5Tokenize(in_RSI,iVar2,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0),
                                nText,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                                (_func_int_void_ptr_int_char_ptr_int_int_int *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  uVar5 = (u8)in_ECX;
  sqlite3_free((void *)0x26ea8f);
  if ((iVar1 == 0) && (iVar1 = (int)local_10, (int)local_10 == 0)) {
    if (in_RSI == (Fts5Config *)0x0) {
      iVar2 = parseGrowPhraseArray
                        ((Fts5Parse *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
      ;
      if (iVar2 != 0) {
        fts5ExprPhraseFree((Fts5ExprPhrase *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
        local_30 = (Fts5Config *)0x0;
        goto LAB_0026eb83;
      }
      *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
    }
    if (local_20 == (Fts5Config *)0x0) {
      local_20 = (Fts5Config *)
                 sqlite3Fts5MallocZero
                           ((int *)in_stack_ffffffffffffff90,
                            (sqlite3_int64)in_stack_ffffffffffffff88);
    }
    else if (*(int *)&local_20->zName != 0) {
      ((Fts5ExprTerm *)&local_20->nCol)[*(int *)&local_20->zName + -1].bPrefix = uVar5;
    }
    *(Fts5Config **)(in_RDI[3] + (long)(*(int *)((long)in_RDI + 0x14) + -1) * 8) = local_20;
  }
  else {
    *(int *)(in_RDI + 2) = iVar1;
    fts5ExprPhraseFree((Fts5ExprPhrase *)CONCAT44(iVar1,in_stack_ffffffffffffffa0));
    local_20 = (Fts5Config *)0x0;
  }
  local_30 = local_20;
LAB_0026eb83:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Fts5ExprPhrase *)local_30;
}

Assistant:

static Fts5ExprPhrase *sqlite3Fts5ParseTerm(
  Fts5Parse *pParse,              /* Parse context */
  Fts5ExprPhrase *pAppend,        /* Phrase to append to */
  Fts5Token *pToken,              /* String to tokenize */
  int bPrefix                     /* True if there is a trailing "*" */
){
  Fts5Config *pConfig = pParse->pConfig;
  TokenCtx sCtx;                  /* Context object passed to callback */
  int rc;                         /* Tokenize return code */
  char *z = 0;

  memset(&sCtx, 0, sizeof(TokenCtx));
  sCtx.pPhrase = pAppend;
  sCtx.pConfig = pConfig;

  rc = fts5ParseStringFromToken(pToken, &z);
  if( rc==SQLITE_OK ){
    int flags = FTS5_TOKENIZE_QUERY | (bPrefix ? FTS5_TOKENIZE_PREFIX : 0);
    int n;
    sqlite3Fts5Dequote(z);
    n = (int)strlen(z);
    rc = sqlite3Fts5Tokenize(pConfig, flags, z, n, &sCtx, fts5ParseTokenize);
  }
  sqlite3_free(z);
  if( rc || (rc = sCtx.rc) ){
    pParse->rc = rc;
    fts5ExprPhraseFree(sCtx.pPhrase);
    sCtx.pPhrase = 0;
  }else{

    if( pAppend==0 ){
      if( parseGrowPhraseArray(pParse) ){
        fts5ExprPhraseFree(sCtx.pPhrase);
        return 0;
      }
      pParse->nPhrase++;
    }

    if( sCtx.pPhrase==0 ){
      /* This happens when parsing a token or quoted phrase that contains
      ** no token characters at all. (e.g ... MATCH '""'). */
      sCtx.pPhrase = sqlite3Fts5MallocZero(&pParse->rc, sizeof(Fts5ExprPhrase));
    }else if( sCtx.pPhrase->nTerm ){
      sCtx.pPhrase->aTerm[sCtx.pPhrase->nTerm-1].bPrefix = (u8)bPrefix;
    }
    assert( pParse->apPhrase!=0 );
    pParse->apPhrase[pParse->nPhrase-1] = sCtx.pPhrase;
  }

  return sCtx.pPhrase;
}